

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

int cimg_library::cimg::fread<unsigned_char>(uchar *ptr,unsigned_long nmemb,FILE *stream)

{
  CImgArgumentException *this;
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  bool local_89;
  size_t local_88;
  unsigned_long l_al_read;
  unsigned_long l_to_read;
  unsigned_long al_read;
  unsigned_long to_read;
  unsigned_long wlimit;
  unsigned_long wlimitT;
  FILE *stream_local;
  unsigned_long nmemb_local;
  uchar *ptr_local;
  
  if ((ptr != (uchar *)0x0) && (stream != (FILE *)0x0)) {
    if (nmemb == 0) {
      ptr_local._4_4_ = 0;
    }
    else {
      l_to_read = 0;
      al_read = nmemb;
      do {
        if (al_read < 0x3f00000) {
          local_88 = al_read;
        }
        else {
          local_88 = 0x3f00000;
        }
        sVar2 = fread(ptr + l_to_read,1,local_88,(FILE *)stream);
        l_to_read = sVar2 + l_to_read;
        al_read = al_read - sVar2;
        local_89 = local_88 == sVar2 && al_read != 0;
      } while (local_89);
      if (al_read != 0) {
        warn("cimg::fread(): Only %u/%u elements could be read from file.",l_to_read,nmemb);
      }
      ptr_local._4_4_ = (int)l_to_read;
    }
    return ptr_local._4_4_;
  }
  this = (CImgArgumentException *)__cxa_allocate_exception(0x10);
  pcVar1 = type<unsigned_char>::string();
  pcVar3 = "";
  if (1 < nmemb) {
    pcVar3 = "s";
  }
  CImgArgumentException::CImgArgumentException
            (this,"cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",
             nmemb,pcVar1,pcVar3,stream,ptr);
  __cxa_throw(this,&CImgArgumentException::typeinfo,CImgArgumentException::~CImgArgumentException);
}

Assistant:

inline int fread(T *const ptr, const unsigned long nmemb, std::FILE *stream) {
      if (!ptr || !stream)
        throw CImgArgumentException("cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",
                                    nmemb,cimg::type<T>::string(),nmemb>1?"s":"",stream,ptr);
      if (!nmemb) return 0;
      const unsigned long wlimitT = 63*1024*1024, wlimit = wlimitT/sizeof(T);
      unsigned long to_read = nmemb, al_read = 0, l_to_read = 0, l_al_read = 0;
      do {
        l_to_read = (to_read*sizeof(T))<wlimitT?to_read:wlimit;
        l_al_read = (unsigned long)std::fread((void*)(ptr + al_read),sizeof(T),l_to_read,stream);
        al_read+=l_al_read;
        to_read-=l_al_read;
      } while (l_to_read==l_al_read && to_read>0);
      if (to_read>0)
        warn("cimg::fread(): Only %u/%u elements could be read from file.",
             al_read,nmemb);
      return (int)al_read;
    }